

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.c
# Opt level: O0

uint8_t * mi_os_claim_huge_pages(size_t pages,size_t *total_size)

{
  uint8_t *puVar1;
  uintptr_t uVar2;
  long *in_RSI;
  long in_RDI;
  bool bVar3;
  uintptr_t r;
  uintptr_t huge_start;
  uintptr_t end;
  uintptr_t start;
  size_t size;
  uint8_t *local_30;
  uint8_t *local_20;
  
  if (in_RSI != (long *)0x0) {
    *in_RSI = 0;
  }
  local_30 = (uint8_t *)mi_huge_start;
  do {
    local_20 = local_30;
    if (local_30 == (uint8_t *)0x0) {
      mi_prim_get_default_heap();
      uVar2 = _mi_heap_random_next((mi_heap_t *)0xb24686);
      local_20 = (uint8_t *)((uVar2 >> 0x11 & 0xfff) * 0x40000000 + 0x200000000000);
    }
    LOCK();
    bVar3 = local_30 != (uint8_t *)mi_huge_start;
    puVar1 = local_20 + in_RDI * 0x40000000;
    if (bVar3) {
      local_30 = (uint8_t *)mi_huge_start;
      puVar1 = (uint8_t *)mi_huge_start;
    }
    mi_huge_start = (uintptr_t)puVar1;
    UNLOCK();
  } while (bVar3);
  if (in_RSI != (long *)0x0) {
    *in_RSI = in_RDI * 0x40000000;
  }
  return local_20;
}

Assistant:

static uint8_t* mi_os_claim_huge_pages(size_t pages, size_t* total_size) {
  if (total_size != NULL) *total_size = 0;
  const size_t size = pages * MI_HUGE_OS_PAGE_SIZE;

  uintptr_t start = 0;
  uintptr_t end = 0;
  uintptr_t huge_start = mi_atomic_load_relaxed(&mi_huge_start);
  do {
    start = huge_start;
    if (start == 0) {
      // Initialize the start address after the 32TiB area
      start = ((uintptr_t)32 << 40);  // 32TiB virtual start address
    #if (MI_SECURE>0 || MI_DEBUG==0)      // security: randomize start of huge pages unless in debug mode
      uintptr_t r = _mi_heap_random_next(mi_prim_get_default_heap());
      start = start + ((uintptr_t)MI_HUGE_OS_PAGE_SIZE * ((r>>17) & 0x0FFF));  // (randomly 12bits)*1GiB == between 0 to 4TiB
    #endif
    }
    end = start + size;
    mi_assert_internal(end % MI_SEGMENT_SIZE == 0);
  } while (!mi_atomic_cas_strong_acq_rel(&mi_huge_start, &huge_start, end));

  if (total_size != NULL) *total_size = size;
  return (uint8_t*)start;
}